

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_d34937::TplModelTest_InitTplStats1_Test::TestBody
          (TplModelTest_InitTplStats1_Test *this)

{
  undefined8 *puVar1;
  _Head_base<0UL,_TplParams_*,_false> _Var2;
  long lVar3;
  pointer *__ptr;
  SEARCH_METHODS *pSVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  AssertionResult gtest_ar;
  unique_ptr<TplParams,_std::default_delete<TplParams>_> tpl_data;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  AssertHelper local_50;
  internal local_48 [8];
  undefined8 *local_40;
  _Head_base<0UL,_TplParams_*,_false> local_38;
  
  local_38._M_head_impl = (TplParams *)operator_new(0x50b8,(nothrow_t *)&std::nothrow);
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<TplParams,std::default_delete<TplParams>>,decltype(nullptr)>
            (local_48,"tpl_data","nullptr",
             (unique_ptr<TplParams,_std::default_delete<TplParams>_> *)&local_38,
             &local_58._M_head_impl);
  puVar1 = local_40;
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = (SEARCH_METHODS *)*local_40;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/tpl_model_test.cc"
               ,0x53,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
    if (local_40 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_40 != local_40 + 2) {
        operator_delete((undefined8 *)*local_40);
      }
      operator_delete(local_40);
    }
  }
  else {
    if (local_40 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_40 != local_40 + 2) {
        operator_delete((undefined8 *)*local_40);
      }
      operator_delete(puVar1);
    }
    _Var2._M_head_impl = local_38._M_head_impl;
    memset(local_38._M_head_impl,0,0x50b8);
    (_Var2._M_head_impl)->ready = 1;
    local_58._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00002760;
    local_50.data_ = (AssertHelperData *)&DAT_00002760;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_48,"sizeof(tpl_data->tpl_stats_buffer)",
               "((2 * 48) + REF_FRAMES + 1) * sizeof(tpl_data->tpl_stats_buffer[0])",
               (unsigned_long *)&local_58,(unsigned_long *)&local_50);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_40 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_40;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/tpl_model_test.cc"
                 ,0x57,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_58._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))();
      }
    }
    puVar1 = local_40;
    if (local_40 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_40 != local_40 + 2) {
        operator_delete((undefined8 *)*local_40);
      }
      operator_delete(puVar1);
    }
    lVar3 = 0x5a8;
    auVar5 = _DAT_00c40090;
    auVar6 = _DAT_00c400a0;
    auVar7 = _DAT_00c400b0;
    auVar8 = _DAT_00c400c0;
    auVar9 = _DAT_00c400d0;
    auVar10 = _DAT_00c400e0;
    auVar11 = _DAT_00c400f0;
    auVar12 = _DAT_00c40100;
    do {
      auVar13 = auVar12 ^ _DAT_00c30d80;
      auVar30._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffff97);
      auVar30._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffff97);
      auVar30._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffff97);
      auVar30._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffff97);
      auVar22._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
      auVar22._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
      auVar22._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
      auVar22._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
      auVar22 = auVar22 & auVar30;
      auVar13 = pshuflw(auVar30,auVar22,0xe8);
      auVar13 = packssdw(auVar13,auVar13);
      lVar14 = auVar12._8_8_;
      if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)local_38._M_head_impl + lVar3 + -0x5a0) = auVar12[0] + '\x01';
      }
      auVar13 = packssdw(auVar22,auVar22);
      auVar13 = packssdw(auVar13,auVar13);
      auVar13 = packsswb(auVar13,auVar13);
      if ((auVar13._0_4_ >> 8 & 1) != 0) {
        *(char *)((long)local_38._M_head_impl + lVar3 + -0x540) = auVar12[8] + '\x01';
      }
      lVar15 = auVar11._8_8_;
      auVar22 = auVar11 ^ _DAT_00c30d80;
      auVar13._0_4_ = -(uint)(auVar22._0_4_ < -0x7fffff97);
      auVar13._4_4_ = -(uint)(auVar22._0_4_ < -0x7fffff97);
      auVar13._8_4_ = -(uint)(auVar22._8_4_ < -0x7fffff97);
      auVar13._12_4_ = -(uint)(auVar22._8_4_ < -0x7fffff97);
      auVar23._0_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
      auVar23._4_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
      auVar23._8_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
      auVar23._12_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
      auVar22 = packssdw(auVar13,auVar23 & auVar13);
      auVar22 = packssdw(auVar22,auVar22);
      auVar22 = packsswb(auVar22,auVar22);
      if ((auVar22._0_4_ >> 0x10 & 1) != 0) {
        *(char *)((long)local_38._M_head_impl + lVar3 + -0x4e0) = auVar11[0] + '\x01';
      }
      auVar13 = pshufhw(auVar22,auVar23 & auVar13,0x84);
      auVar13 = packssdw(auVar13,auVar13);
      auVar13 = packsswb(auVar13,auVar13);
      if ((auVar13._0_4_ >> 0x18 & 1) != 0) {
        *(char *)((long)local_38._M_head_impl + lVar3 + -0x480) = auVar11[8] + '\x01';
      }
      lVar16 = auVar10._8_8_;
      auVar13 = auVar10 ^ _DAT_00c30d80;
      auVar31._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffff97);
      auVar31._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffff97);
      auVar31._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffff97);
      auVar31._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffff97);
      auVar24._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
      auVar24._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
      auVar24._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
      auVar24._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
      auVar24 = auVar24 & auVar31;
      auVar13 = pshuflw(auVar13,auVar24,0xe8);
      auVar13 = packssdw(auVar13,auVar13);
      auVar13 = packsswb(auVar13,auVar13);
      if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)((long)local_38._M_head_impl + lVar3 + -0x420) = auVar10[0] + '\x01';
      }
      auVar22 = packssdw(auVar24,auVar24);
      auVar13 = packssdw(auVar13,auVar22);
      auVar13 = packsswb(auVar13,auVar13);
      if ((auVar13._4_2_ >> 8 & 1) != 0) {
        *(char *)((long)local_38._M_head_impl + lVar3 + -0x3c0) = auVar10[8] + '\x01';
      }
      lVar17 = auVar9._8_8_;
      auVar13 = auVar9 ^ _DAT_00c30d80;
      auVar32._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffff97);
      auVar32._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffff97);
      auVar32._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffff97);
      auVar32._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffff97);
      auVar25._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
      auVar25._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
      auVar25._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
      auVar25._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
      auVar13 = packssdw(auVar13,auVar25 & auVar32);
      auVar13 = packssdw(auVar13,auVar13);
      auVar13 = packsswb(auVar13,auVar13);
      if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)local_38._M_head_impl + lVar3 + -0x360) = auVar9[0] + '\x01';
      }
      auVar13 = pshufhw(auVar13,auVar25 & auVar32,0x84);
      auVar13 = packssdw(auVar13,auVar13);
      auVar13 = packsswb(auVar13,auVar13);
      if ((auVar13._6_2_ >> 8 & 1) != 0) {
        *(char *)((long)local_38._M_head_impl + lVar3 + -0x300) = auVar9[8] + '\x01';
      }
      lVar18 = auVar8._8_8_;
      auVar13 = auVar8 ^ _DAT_00c30d80;
      auVar33._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffff97);
      auVar33._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffff97);
      auVar33._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffff97);
      auVar33._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffff97);
      auVar26._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
      auVar26._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
      auVar26._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
      auVar26._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
      auVar26 = auVar26 & auVar33;
      auVar13 = pshuflw(auVar13,auVar26,0xe8);
      auVar13 = packssdw(auVar13,auVar13);
      auVar13 = packsswb(auVar13,auVar13);
      if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)local_38._M_head_impl + lVar3 + -0x2a0) = auVar8[0] + '\x01';
      }
      auVar22 = packssdw(auVar26,auVar26);
      auVar22 = packssdw(auVar22,auVar22);
      auVar13 = packsswb(auVar13,auVar22);
      if ((auVar13._8_2_ >> 8 & 1) != 0) {
        *(char *)((long)local_38._M_head_impl + lVar3 + -0x240) = auVar8[8] + '\x01';
      }
      lVar19 = auVar7._8_8_;
      auVar13 = auVar7 ^ _DAT_00c30d80;
      auVar34._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffff97);
      auVar34._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffff97);
      auVar34._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffff97);
      auVar34._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffff97);
      auVar27._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
      auVar27._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
      auVar27._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
      auVar27._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
      auVar13 = packssdw(auVar13,auVar27 & auVar34);
      auVar13 = packssdw(auVar13,auVar13);
      auVar13 = packsswb(auVar13,auVar13);
      if ((auVar13 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(char *)((long)local_38._M_head_impl + lVar3 + -0x1e0) = auVar7[0] + '\x01';
      }
      auVar13 = pshufhw(auVar13,auVar27 & auVar34,0x84);
      auVar13 = packssdw(auVar13,auVar13);
      auVar13 = packsswb(auVar13,auVar13);
      if ((auVar13._10_2_ >> 8 & 1) != 0) {
        *(char *)((long)local_38._M_head_impl + lVar3 + -0x180) = auVar7[8] + '\x01';
      }
      lVar20 = auVar6._8_8_;
      auVar13 = auVar6 ^ _DAT_00c30d80;
      auVar35._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffff97);
      auVar35._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffff97);
      auVar35._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffff97);
      auVar35._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffff97);
      auVar28._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
      auVar28._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
      auVar28._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
      auVar28._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
      auVar28 = auVar28 & auVar35;
      auVar13 = pshuflw(auVar13,auVar28,0xe8);
      auVar13 = packssdw(auVar13,auVar13);
      auVar13 = packsswb(auVar13,auVar13);
      if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)((long)local_38._M_head_impl + lVar3 + -0x120) = auVar6[0] + '\x01';
      }
      auVar22 = packssdw(auVar28,auVar28);
      auVar13 = packssdw(auVar13,auVar22);
      auVar13 = packsswb(auVar13,auVar13);
      if ((auVar13._12_2_ >> 8 & 1) != 0) {
        *(char *)((long)local_38._M_head_impl + lVar3 + -0xc0) = auVar6[8] + '\x01';
      }
      lVar21 = auVar5._8_8_;
      auVar13 = auVar5 ^ _DAT_00c30d80;
      auVar36._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffff97);
      auVar36._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffff97);
      auVar36._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffff97);
      auVar36._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffff97);
      auVar29._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
      auVar29._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
      auVar29._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
      auVar29._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
      auVar13 = packssdw(auVar13,auVar29 & auVar36);
      auVar13 = packssdw(auVar13,auVar13);
      auVar13 = packsswb(auVar13,auVar13);
      if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)(local_38._M_head_impl)->tpl_stats_buffer + lVar3 + -0x68) =
             auVar5[0] + '\x01';
      }
      auVar13 = pshufhw(auVar13,auVar29 & auVar36,0x84);
      auVar13 = packssdw(auVar13,auVar13);
      auVar13 = packsswb(auVar13,auVar13);
      if ((auVar13._14_2_ >> 8 & 1) != 0) {
        *(char *)((long)(local_38._M_head_impl)->tpl_stats_buffer[0].ref_map_index + lVar3 + -0x28)
             = auVar5[8] + '\x01';
      }
      auVar12._0_8_ = auVar12._0_8_ + 0x10;
      auVar12._8_8_ = lVar14 + 0x10;
      auVar11._0_8_ = auVar11._0_8_ + 0x10;
      auVar11._8_8_ = lVar15 + 0x10;
      auVar10._0_8_ = auVar10._0_8_ + 0x10;
      auVar10._8_8_ = lVar16 + 0x10;
      auVar9._0_8_ = auVar9._0_8_ + 0x10;
      auVar9._8_8_ = lVar17 + 0x10;
      auVar8._0_8_ = auVar8._0_8_ + 0x10;
      auVar8._8_8_ = lVar18 + 0x10;
      auVar7._0_8_ = auVar7._0_8_ + 0x10;
      auVar7._8_8_ = lVar19 + 0x10;
      auVar6._0_8_ = auVar6._0_8_ + 0x10;
      auVar6._8_8_ = lVar20 + 0x10;
      auVar5._0_8_ = auVar5._0_8_ + 0x10;
      auVar5._8_8_ = lVar21 + 0x10;
      lVar3 = lVar3 + 0x600;
    } while (lVar3 != 0x2fa8);
    av1_init_tpl_stats(local_38._M_head_impl);
    local_58._M_head_impl = local_58._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,int>
              (local_48,"tpl_data->ready","0",&(local_38._M_head_impl)->ready,(int *)&local_58);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_40 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_40;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/tpl_model_test.cc"
                 ,0x5d,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_58._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))();
      }
    }
    puVar1 = local_40;
    if (local_40 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_40 != local_40 + 2) {
        operator_delete((undefined8 *)*local_40);
      }
      operator_delete(puVar1);
    }
    lVar3 = 8;
    do {
      local_58._M_head_impl = local_58._M_head_impl & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                (local_48,"tpl_data->tpl_stats_buffer[i].is_valid","0",
                 (uchar *)((long)(local_38._M_head_impl)->tpl_stats_buffer[0].ref_map_index +
                          lVar3 + -0x28),(int *)&local_58);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        pSVar4 = "";
        if (local_40 != (undefined8 *)0x0) {
          pSVar4 = (SEARCH_METHODS *)*local_40;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/tpl_model_test.cc"
                   ,0x5f,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_58._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_58._M_head_impl + 8))();
        }
      }
      puVar1 = local_40;
      if (local_40 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_40 != local_40 + 2) {
          operator_delete((undefined8 *)*local_40);
        }
        operator_delete(puVar1);
      }
      lVar3 = lVar3 + 0x60;
    } while (lVar3 != 0x2768);
  }
  if (local_38._M_head_impl != (TplParams *)0x0) {
    operator_delete(local_38._M_head_impl);
  }
  return;
}

Assistant:

TEST(TplModelTest, InitTplStats1) {
  // We use heap allocation instead of stack allocation here to avoid
  // -Wstack-usage warning.
  std::unique_ptr<TplParams> tpl_data(new (std::nothrow) TplParams);
  ASSERT_NE(tpl_data, nullptr);
  av1_zero(*tpl_data);
  tpl_data->ready = 1;
  EXPECT_EQ(sizeof(tpl_data->tpl_stats_buffer),
            MAX_LENGTH_TPL_FRAME_STATS * sizeof(tpl_data->tpl_stats_buffer[0]));
  for (int i = 0; i < MAX_LENGTH_TPL_FRAME_STATS; ++i) {
    // Set it to a random non-zero number
    tpl_data->tpl_stats_buffer[i].is_valid = i + 1;
  }
  av1_init_tpl_stats(tpl_data.get());
  EXPECT_EQ(tpl_data->ready, 0);
  for (int i = 0; i < MAX_LENGTH_TPL_FRAME_STATS; ++i) {
    EXPECT_EQ(tpl_data->tpl_stats_buffer[i].is_valid, 0);
  }
}